

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::RegisterTests
          (ParameterizedTestSuiteInfo<meas64Problems> *this)

{
  pointer psVar1;
  pointer pIVar2;
  code *pcVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
  _Var4;
  _Alloc_hider name;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *value;
  ostream *poVar9;
  size_type sVar10;
  char *pcVar11;
  undefined4 extraout_var_02;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_03;
  pointer psVar12;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> local_1b8;
  char *local_1b0;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> local_1a8;
  string local_1a0;
  pointer local_180;
  size_type local_178;
  ParamGenerator<int> generator;
  string param_name;
  string test_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  undefined4 extraout_var_01;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  bVar6 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (this->tests_).
                 super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar1; psVar12 = psVar12 + 1
      ) {
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_180 = psVar12;
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pIVar2; __lhs = __lhs + 1) {
      (*(code *)__lhs->generator)(&generator);
      pcVar3 = (code *)__lhs->name_func;
      local_1b0 = __lhs->file;
      iVar8 = __lhs->line;
      if ((__lhs->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar7 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1b8._M_head_impl = (ParamIteratorInterface<int> *)CONCAT44(extraout_var,iVar7);
      iVar7 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      local_1a8._M_head_impl = (ParamIteratorInterface<int> *)CONCAT44(extraout_var_00,iVar7);
      local_178 = 0;
      while( true ) {
        bVar5 = ParamIterator<int>::operator!=
                          ((ParamIterator<int> *)&local_1b8,(ParamIterator<int> *)&local_1a8);
        if (!bVar5) break;
        iVar7 = (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        value = (int *)CONCAT44(extraout_var_01,iVar7);
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        local_1a0._M_dataplus._M_p._0_4_ = *value;
        local_1a0._M_string_length = local_178;
        (*pcVar3)(&param_name,&local_1a0);
        bVar6 = IsValidParamName(&param_name);
        bVar6 = IsTrue(bVar6);
        if (!bVar6) {
          GTestLog::GTestLog((GTestLog *)&local_1a0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar9 = std::operator<<(poVar9,"Parameterized test name \'");
          poVar9 = std::operator<<(poVar9,(string *)&param_name);
          poVar9 = std::operator<<(poVar9,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar9 = std::operator<<(poVar9,local_1b0);
          poVar9 = std::operator<<(poVar9," line ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
          poVar9 = std::operator<<(poVar9,"");
          std::endl<char,std::char_traits<char>>(poVar9);
          GTestLog::~GTestLog((GTestLog *)&local_1a0);
        }
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar6 = IsTrue(sVar10 == 0);
        if (!bVar6) {
          GTestLog::GTestLog((GTestLog *)&local_1a0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar9 = std::operator<<(poVar9,"Duplicate parameterized test name \'");
          poVar9 = std::operator<<(poVar9,(string *)&param_name);
          poVar9 = std::operator<<(poVar9,"\', in ");
          poVar9 = std::operator<<(poVar9,local_1b0);
          poVar9 = std::operator<<(poVar9," line ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
          std::endl<char,std::char_traits<char>>(poVar9);
          GTestLog::~GTestLog((GTestLog *)&local_1a0);
        }
        if ((((psVar12->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar11 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar11);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_a0,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        PrintToString<int>(&local_1a0,value);
        pcVar11 = (char *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,(int)local_1a0._M_dataplus._M_p)
        ;
        CodeLocation::CodeLocation
                  (&local_58,
                   &((psVar12->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        set_up_tc = SuiteApiResolver<meas64Problems>::GetSetUpCaseOrSuite(local_1b0,iVar8);
        tear_down_tc = SuiteApiResolver<meas64Problems>::GetTearDownCaseOrSuite(local_1b0,iVar8);
        _Var4.super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>.
        _M_head_impl = (((local_180->
                         super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->test_meta_factory)._M_t.
                       super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<int>,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
                       .super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>;
        factory = (TestFactoryBase *)
                  (**(code **)(*(long *)_Var4.
                                        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
                                        ._M_head_impl + 0x10))
                            (_Var4.
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
                             ._M_head_impl,*value);
        MakeAndRegisterTestInfo
                  (&local_a0,name._M_p,(char *)0x0,pcVar11,&local_58,
                   (TypeId)CONCAT44(extraout_var_02,iVar7),set_up_tc,tear_down_tc,factory);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_a0);
        local_178 = local_178 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar6 = true;
        (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        psVar12 = local_180;
      }
      if (local_1a8._M_head_impl != (ParamIteratorInterface<int> *)0x0) {
        (*(local_1a8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      if (local_1b8._M_head_impl != (ParamIteratorInterface<int> *)0x0) {
        (*(local_1b8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
  }
  if (!bVar6) {
    iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      (this);
    CodeLocation::CodeLocation(&local_80,&this->code_location_);
    InsertSyntheticTestCase
              ((string *)CONCAT44(extraout_var_03,iVar8),&local_80,
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<meas64Problems>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::~string((string *)&test_name);
  std::__cxx11::string::~string((string *)&test_suite_name);
  return;
}

Assistant:

iterator begin() const { return iterator(impl_->Begin()); }